

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O0

void __thiscall dlib::tooltip::disable(tooltip *this)

{
  bool bVar1;
  rmutex *in_RDI;
  base_window *unaff_retaddr;
  auto_mutex M;
  timer<dlib::tooltip> *in_stack_ffffffffffffffd0;
  drawable *in_stack_fffffffffffffff0;
  
  auto_mutex::auto_mutex((auto_mutex *)in_stack_ffffffffffffffd0,in_RDI);
  drawable::disable(in_stack_fffffffffffffff0);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_> *)
                     0x45358b);
  if (bVar1) {
    std::unique_ptr<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_>::operator->
              ((unique_ptr<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_> *)
               0x4535a1);
    timer<dlib::tooltip>::stop(in_stack_ffffffffffffffd0);
    std::unique_ptr<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_>::operator->
              ((unique_ptr<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_> *)
               0x4535c2);
    base_window::hide(unaff_retaddr);
  }
  auto_mutex::~auto_mutex((auto_mutex *)0x4535f6);
  return;
}

Assistant:

void disable (
        )
        {
            auto_mutex M(m);
            mouse_over_event::disable();
            if (stuff)
            {
                stuff->tt_timer.stop();
                stuff->win.hide();
            }
        }